

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cc
# Opt level: O2

void re2::RandomTest(int maxatoms,int maxops,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *alphabet,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *ops,int maxstrlen,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *stralphabet,string *wrapper)

{
  allocator local_2d1;
  ExhaustiveTester t;
  LogMessageFatal local_1b0;
  
  std::__cxx11::string::string((string *)&local_1b0,"",&local_2d1);
  ExhaustiveTester::ExhaustiveTester
            (&t,maxatoms + -1,maxops + -1,alphabet,ops,(uint)maxstrlen >> 1,stralphabet,wrapper,
             (string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  t.randomstrings_ = true;
  t.stringseed_ = FLAGS_stringseed;
  t.stringcount_ = FLAGS_stringcount;
  RegexpGenerator::GenerateRandom(&t.super_RegexpGenerator,FLAGS_regexpseed,FLAGS_regexpcount);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",(ulong)(uint)t.regexps_,
         (ulong)(uint)t.tests_,(ulong)(uint)t.failures_,(uint)maxstrlen >> 1,
         (ulong)((long)(stralphabet->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(stralphabet->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (t.failures_ != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/random_test.cc"
               ,0x28);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                    "Check failed: (0) == (t.failures())");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  ExhaustiveTester::~ExhaustiveTester(&t);
  return;
}

Assistant:

static void RandomTest(int maxatoms, int maxops,
                       const vector<string>& alphabet,
                       const vector<string>& ops,
                       int maxstrlen, const vector<string>& stralphabet,
                       const string& wrapper) {
  // Limit to smaller test cases in debug mode,
  // because everything is so much slower.
  if (RE2_DEBUG_MODE) {
    maxatoms--;
    maxops--;
    maxstrlen /= 2;
  }

  ExhaustiveTester t(maxatoms, maxops, alphabet, ops,
                     maxstrlen, stralphabet, wrapper, "");
  t.RandomStrings(FLAGS_stringseed, FLAGS_stringcount);
  t.GenerateRandom(FLAGS_regexpseed, FLAGS_regexpcount);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",
         t.regexps(), t.tests(), t.failures(), maxstrlen, (int)stralphabet.size());
  EXPECT_EQ(0, t.failures());
}